

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1.c
# Opt level: O2

opj_bool allocate_buffers(opj_t1_t *t1,int w,int h)

{
  int *__ptr;
  flag_t *__ptr_00;
  int iVar1;
  size_t sVar2;
  
  iVar1 = h * w;
  __ptr = t1->data;
  if (t1->datasize < iVar1) {
    free(__ptr);
    sVar2 = (long)iVar1 << 2;
    __ptr = (int *)malloc(sVar2);
    t1->data = __ptr;
    if (__ptr == (int *)0x0) {
      return 0;
    }
    t1->datasize = iVar1;
  }
  else {
    sVar2 = (long)iVar1 << 2;
  }
  memset(__ptr,0,sVar2);
  t1->flags_stride = w + 2;
  iVar1 = (h + 2) * (w + 2);
  __ptr_00 = t1->flags;
  if (t1->flagssize < iVar1) {
    free(__ptr_00);
    sVar2 = (long)iVar1 * 2;
    __ptr_00 = (flag_t *)malloc(sVar2);
    t1->flags = __ptr_00;
    if (__ptr_00 == (flag_t *)0x0) {
      return 0;
    }
    t1->flagssize = iVar1;
  }
  else {
    sVar2 = (long)iVar1 * 2;
  }
  memset(__ptr_00,0,sVar2);
  t1->w = w;
  t1->h = h;
  return 1;
}

Assistant:

static opj_bool allocate_buffers(
		opj_t1_t *t1,
		int w,
		int h)
{
	int datasize=w * h;
	int flagssize;

	if(datasize > t1->datasize){
		opj_aligned_free(t1->data);
		t1->data = (int*) opj_aligned_malloc(datasize * sizeof(int));
		if(!t1->data){
			return OPJ_FALSE;
		}
		t1->datasize=datasize;
	}
	memset(t1->data,0,datasize * sizeof(int));

	t1->flags_stride=w+2;
	flagssize=t1->flags_stride * (h+2);

	if(flagssize > t1->flagssize){
		opj_aligned_free(t1->flags);
		t1->flags = (flag_t*) opj_aligned_malloc(flagssize * sizeof(flag_t));
		if(!t1->flags){
			return OPJ_FALSE;
		}
		t1->flagssize=flagssize;
	}
	memset(t1->flags,0,flagssize * sizeof(flag_t));

	t1->w=w;
	t1->h=h;

	return OPJ_TRUE;
}